

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void rdr_loadpat(rdr_t *rdr,FILE *file)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  ushort **ppuVar6;
  __int32_t **pp_Var7;
  pat_t *ppVar8;
  pat_t **pppVar9;
  uint uVar10;
  long lVar11;
  
  do {
    iVar4 = feof((FILE *)file);
    if (iVar4 != 0) {
      return;
    }
    __s = rdr_readline(file);
    if (__s == (char *)0x0) {
      return;
    }
    sVar5 = strcspn(__s,"#");
    if ((int)sVar5 != 0) {
      ppuVar6 = __ctype_b_loc();
      lVar11 = (long)(int)sVar5;
      do {
        if ((*(byte *)((long)*ppuVar6 + (long)__s[lVar11 + -1] * 2 + 1) & 0x20) == 0) {
          __s[lVar11] = '\0';
          pp_Var7 = __ctype_tolower_loc();
          *__s = (char)(*pp_Var7)[*__s];
          ppVar8 = pat_comp(__s);
          rdr->npats = rdr->npats + 1;
          cVar3 = *__s;
          if (cVar3 == '*') {
            uVar1 = rdr->nuni;
            uVar2 = rdr->nbi;
            rdr->nuni = uVar1 + 1;
            rdr->nbi = uVar2 + 1;
          }
          else if (cVar3 == 'b') {
            rdr->nbi = rdr->nbi + 1;
          }
          else {
            if (cVar3 != 'u') {
              fatal("unknown pattern type \'%c\'",(ulong)(uint)(int)cVar3);
            }
            rdr->nuni = rdr->nuni + 1;
          }
          pppVar9 = (pat_t **)xrealloc(rdr->pats,(ulong)rdr->npats << 3);
          rdr->pats = pppVar9;
          pppVar9[rdr->npats - 1] = ppVar8;
          uVar10 = ppVar8->ntoks;
          if (ppVar8->ntoks < rdr->ntoks) {
            uVar10 = rdr->ntoks;
          }
          rdr->ntoks = uVar10;
          goto LAB_0010d3f3;
        }
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    free(__s);
LAB_0010d3f3:
    if (__s == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void rdr_loadpat(rdr_t *rdr, FILE *file) {
	while (!feof(file)) {
		// Read raw input line
		char *line = rdr_readline(file);
		if (line == NULL)
			break;
		// Remove comments and trailing spaces
		int end = strcspn(line, "#");
		while (end != 0 && isspace(line[end - 1]))
			end--;
		if (end == 0) {
			free(line);
			continue;
		}
		line[end] = '\0';
		line[0] = tolower(line[0]);
		// Compile pattern and add it to the list
		pat_t *pat = pat_comp(line);
		rdr->npats++;
		switch (line[0]) {
			case 'u': rdr->nuni++; break;
			case 'b': rdr->nbi++; break;
			case '*': rdr->nuni++;
			          rdr->nbi++; break;
			default:
				fatal("unknown pattern type '%c'", line[0]);
		}
		rdr->pats = xrealloc(rdr->pats, sizeof(char *) * rdr->npats);
		rdr->pats[rdr->npats - 1] = pat;
		rdr->ntoks = max(rdr->ntoks, pat->ntoks);
	}
}